

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

char * codec2str(cram_encoding codec)

{
  char *pcStack_10;
  cram_encoding codec_local;
  
  switch(codec) {
  case E_NULL:
    pcStack_10 = "NULL";
    break;
  case E_EXTERNAL:
    pcStack_10 = "EXTERNAL";
    break;
  case E_GOLOMB:
    pcStack_10 = "GOLOMB";
    break;
  case E_HUFFMAN:
    pcStack_10 = "HUFFMAN";
    break;
  case E_BYTE_ARRAY_LEN:
    pcStack_10 = "BYTE_ARRAY_LEN";
    break;
  case E_BYTE_ARRAY_STOP:
    pcStack_10 = "BYTE_ARRAY_STOP";
    break;
  case E_BETA:
    pcStack_10 = "BETA";
    break;
  case E_SUBEXP:
    pcStack_10 = "SUBEXP";
    break;
  case E_GOLOMB_RICE:
    pcStack_10 = "GOLOMB_RICE";
    break;
  case E_GAMMA:
    pcStack_10 = "GAMMA";
    break;
  default:
    pcStack_10 = "(unknown)";
  }
  return pcStack_10;
}

Assistant:

static char *codec2str(enum cram_encoding codec) {
    switch (codec) {
    case E_NULL:            return "NULL";
    case E_EXTERNAL:        return "EXTERNAL";
    case E_GOLOMB:          return "GOLOMB";
    case E_HUFFMAN:         return "HUFFMAN";
    case E_BYTE_ARRAY_LEN:  return "BYTE_ARRAY_LEN";
    case E_BYTE_ARRAY_STOP: return "BYTE_ARRAY_STOP";
    case E_BETA:            return "BETA";
    case E_SUBEXP:          return "SUBEXP";
    case E_GOLOMB_RICE:     return "GOLOMB_RICE";
    case E_GAMMA:           return "GAMMA";
    }

    return "(unknown)";
}